

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_file_system.cpp
# Opt level: O1

void __thiscall duckdb::MiniZStreamWrapper::Close(MiniZStreamWrapper *this)

{
  _Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false> _Var1;
  idx_t iVar2;
  undefined8 in_RAX;
  pointer pFVar3;
  uchar gzip_footer [8];
  undefined8 local_18;
  
  _Var1._M_head_impl =
       (this->mz_stream_ptr).
       super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
       .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (mz_streamp)0x0) {
    if (this->writing == true) {
      FlushStream(this);
      iVar2 = this->total_size;
      local_18 = CONCAT17((char)(iVar2 >> 0x18),
                          CONCAT16((char)(iVar2 >> 0x10),
                                   CONCAT15((char)(iVar2 >> 8),CONCAT14((char)iVar2,(int)this->crc))
                                  ));
      pFVar3 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
               operator->(&this->file->child_handle);
      (*pFVar3->file_system->_vptr_FileSystem[6])(pFVar3->file_system,pFVar3,&local_18,8);
      duckdb_miniz::mz_deflateEnd
                ((this->mz_stream_ptr).
                 super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                 .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl);
    }
    else {
      local_18 = in_RAX;
      duckdb_miniz::mz_inflateEnd(_Var1._M_head_impl);
    }
    _Var1._M_head_impl =
         (this->mz_stream_ptr).
         super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
         .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl;
    (this->mz_stream_ptr).
    super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
    .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl = (mz_stream_s *)0x0;
    if (_Var1._M_head_impl != (mz_stream_s *)0x0) {
      operator_delete(_Var1._M_head_impl);
    }
    this->file = (CompressedFile *)0x0;
  }
  return;
}

Assistant:

void MiniZStreamWrapper::Close() {
	if (!mz_stream_ptr) {
		return;
	}
	if (writing) {
		// flush anything remaining in the stream
		FlushStream();

		// write the footer
		unsigned char gzip_footer[MiniZStream::GZIP_FOOTER_SIZE];
		MiniZStream::InitializeGZIPFooter(gzip_footer, crc, total_size);
		file->child_handle->Write(gzip_footer, MiniZStream::GZIP_FOOTER_SIZE);

		duckdb_miniz::mz_deflateEnd(mz_stream_ptr.get());
	} else {
		duckdb_miniz::mz_inflateEnd(mz_stream_ptr.get());
	}
	mz_stream_ptr = nullptr;
	file = nullptr;
}